

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExclusiveTermAppender.h
# Opt level: O0

void __thiscall
aeron::concurrent::logbuffer::ExclusiveTermAppender::ExclusiveTermAppender
          (ExclusiveTermAppender *this,AtomicBuffer *termBuffer,AtomicBuffer *metaDataBuffer,
          int partitionIndex)

{
  uint8_t *puVar1;
  int in_ECX;
  AtomicBuffer *in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = in_RSI;
  puVar1 = AtomicBuffer::buffer(in_RDX);
  in_RDI[1] = puVar1 + (long)in_ECX * 8;
  AtomicBuffer::boundsCheck(in_RDX,in_ECX << 3,8);
  return;
}

Assistant:

ExclusiveTermAppender(AtomicBuffer& termBuffer, AtomicBuffer& metaDataBuffer, const int partitionIndex) :
        m_termBuffer(termBuffer),
        m_tailAddr(
            reinterpret_cast<std::int64_t *>(
                metaDataBuffer.buffer() +
                LogBufferDescriptor::TERM_TAIL_COUNTER_OFFSET +
                (partitionIndex * sizeof(std::int64_t))))
    {
        metaDataBuffer.boundsCheck(
            LogBufferDescriptor::TERM_TAIL_COUNTER_OFFSET + (partitionIndex * sizeof(std::int64_t)),
            sizeof(std::int64_t));
    }